

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

size_t stumpless_read_buffer(stumpless_target *target,char *buffer,size_t max_length)

{
  char cVar1;
  long *plVar2;
  ulong uVar3;
  char *message;
  ulong uVar4;
  
  if (target == (stumpless_target *)0x0) {
    message = "target was NULL";
  }
  else {
    if (buffer != (char *)0x0 && max_length != 0) {
      plVar2 = (long *)target->id;
      pthread_lock_mutex((pthread_mutex_t *)(plVar2 + 4));
      uVar3 = plVar2[2];
      uVar4 = 0;
      if (max_length != 1 && uVar3 != plVar2[3]) {
        do {
          cVar1 = *(char *)(*plVar2 + uVar3);
          buffer[uVar4] = cVar1;
          uVar3 = (uVar3 + 1) % (ulong)plVar2[1];
          if (cVar1 == '\0') goto LAB_00110a34;
          uVar4 = uVar4 + 1;
        } while ((uVar3 != plVar2[3]) && (uVar4 < max_length - 1));
      }
      buffer[uVar4] = '\0';
LAB_00110a34:
      plVar2[2] = uVar3;
      pthread_unlock_mutex((pthread_mutex_t *)(plVar2 + 4));
      return uVar4 + 1;
    }
    message = "buffer was NULL";
  }
  raise_argument_empty(message);
  return 0;
}

Assistant:

size_t
stumpless_read_buffer( struct stumpless_target *target,
                       char *buffer,
                       size_t max_length ) {
  struct buffer_target *buffer_target;
  size_t read_position;
  size_t out_position = 0;

  if( !target ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "target" ) );
    return 0;
  }

  if( !buffer || max_length == 0 ) {
    raise_argument_empty( L10N_NULL_ARG_ERROR_MESSAGE( "buffer" ) );
    return 0;
  }

  buffer_target = ( struct buffer_target * ) target->id;

  config_lock_mutex( &buffer_target->buffer_mutex );

  read_position = buffer_target->read_position;
  while( read_position != buffer_target->write_position &&
         out_position < max_length - 1 ) {
    buffer[out_position] = buffer_target->buffer[read_position];
    read_position = ( read_position + 1 ) % buffer_target->size;

    if( buffer[out_position] == '\0' ) {
      goto cleanup_and_return;
    }

    out_position++;
  }

  buffer[out_position] = '\0';

cleanup_and_return:
  buffer_target->read_position = read_position;
  config_unlock_mutex( &buffer_target->buffer_mutex );
  return out_position + 1;
}